

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_append_columns(fitsfile *ff,NGP_HDU *ngph,int aftercol)

{
  NGP_TOKEN *pNVar1;
  bool bVar2;
  int iVar3;
  undefined4 in_register_00000014;
  long lVar4;
  long lVar5;
  char *tform;
  int ngph_i;
  int r;
  char ngph_ctmp;
  uint local_58;
  int local_54;
  uint local_50;
  undefined1 local_49;
  char *local_48;
  fitsfile *local_40;
  ulong local_38;
  
  local_38 = CONCAT44(in_register_00000014,aftercol);
  local_54 = 0x16a;
  if (ngph != (NGP_HDU *)0x0 && ff != (fitsfile *)0x0) {
    if (ngph->tokcnt == 0) {
      local_54 = 0;
    }
    else {
      local_54 = 0;
      local_40 = ff;
      if (aftercol < 999) {
        do {
          local_50 = (int)local_38 + 1;
          lVar4 = -1;
          lVar5 = 0;
          tform = (char *)0x0;
          local_48 = "";
          do {
            iVar3 = __isoc99_sscanf(ngph->tok->name + lVar5,"TFORM%d%c",&local_58,&local_49);
            pNVar1 = ngph->tok;
            if (iVar3 == 1) {
              if ((*(int *)(pNVar1->name + lVar5 + -4) == 2) && (local_58 == local_50)) {
                tform = *(char **)(pNVar1->comment + lVar5 + -0x10);
              }
            }
            else {
              iVar3 = __isoc99_sscanf(pNVar1->name + lVar5,"TTYPE%d%c",&local_58,&local_49);
              if (((iVar3 == 1) && (*(int *)(ngph->tok->name + lVar5 + -4) == 2)) &&
                 (local_58 == local_50)) {
                local_48 = *(char **)(ngph->tok->comment + lVar5 + -0x10);
              }
            }
            if ((tform != (char *)0x0) && (*local_48 != '\0')) {
              bVar2 = false;
              goto LAB_0017a53f;
            }
            lVar5 = lVar5 + 0xb0;
            lVar4 = lVar4 + 1;
          } while (lVar4 < (long)ngph->tokcnt + -1);
          bVar2 = true;
LAB_0017a53f:
          if ((tform != (char *)0x0) && (local_54 == 0)) {
            fficol(local_40,(int)local_38 + 1,local_48,tform,&local_54);
          }
        } while ((!bVar2 && local_54 == 0) && (local_38 = (ulong)local_50, local_50 != 999));
      }
    }
  }
  return local_54;
}

Assistant:

int	ngp_append_columns(fitsfile *ff, NGP_HDU *ngph, int aftercol)
 { int		r, i, j, exitflg, ngph_i;
   char 	*my_tform, *my_ttype;
   char		ngph_ctmp;


   if (NULL == ff) return(NGP_NUL_PTR);
   if (NULL == ngph) return(NGP_NUL_PTR);
   if (0 == ngph->tokcnt) return(NGP_OK);	/* nothing to do ! */

   r = NGP_OK;
   exitflg = 0;

   for (j=aftercol; j<NGP_MAX_ARRAY_DIM; j++)	/* 0 for table, 6 for group */
    { 
      my_tform = NULL;
      my_ttype = "";
    
      for (i=0; ; i++)
       { if (1 == sscanf(ngph->tok[i].name, "TFORM%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
   	    { my_tform = ngph->tok[i].value.s;
   	    }
                }
         else if (1 == sscanf(ngph->tok[i].name, "TTYPE%d%c", &ngph_i, &ngph_ctmp))
           { if ((NGP_TTYPE_STRING == ngph->tok[i].type) && (ngph_i == (j + 1)))
               { my_ttype = ngph->tok[i].value.s;
               }
           }
         
         if ((NULL != my_tform) && (my_ttype[0])) break;
         
         if (i < (ngph->tokcnt - 1)) continue;
         exitflg = 1;
         break;
       }
      if ((NGP_OK == r) && (NULL != my_tform))
        fits_insert_col(ff, j + 1, my_ttype, my_tform, &r);

      if ((NGP_OK != r) || exitflg) break;
    }
   return(r);
 }